

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *tag,word *ptr)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  WirePointer *typedPtr;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  WirePointer *ref;
  Fault f;
  Fault local_50;
  word *local_48;
  long local_40;
  ulong local_38;
  
  if (segment->readOnly != false) {
    return;
  }
  switch((tag->offsetAndKind).value & 3) {
  case 0:
    uVar2 = *(ushort *)&tag->field_1;
    uVar5 = (ulong)(tag->field_1).structRef.ptrCount.value;
    if (uVar5 == 0) {
      uVar3 = 0;
    }
    else {
      ref = (WirePointer *)(ptr + uVar2);
      do {
        zeroObject(segment,capTable,ref);
        ref = ref + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      uVar2 = (tag->field_1).structRef.dataSize.value;
      uVar3 = (uint)(tag->field_1).structRef.ptrCount.value;
    }
    if (uVar2 + uVar3 == 0) {
      return;
    }
    uVar3 = (uVar2 + uVar3) * 8;
    break;
  case 1:
    uVar3 = (tag->field_1).upper32Bits;
    switch(uVar3 & 7) {
    case 0:
      return;
    default:
      uVar5 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)((byte)uVar3 & 7) * 4) *
              (ulong)(uVar3 >> 3) + 0x3f;
      if ((int)(uVar5 >> 6) == 0) {
        return;
      }
      uVar3 = (uint)(uVar5 >> 3) & 0xfffffff8;
      break;
    case 6:
      if (uVar3 < 8) {
        return;
      }
      uVar5 = 0;
      do {
        zeroObject(segment,capTable,(WirePointer *)((long)&ptr->content + uVar5));
        uVar5 = uVar5 + 8;
      } while ((uVar3 & 0xfffffff8) != uVar5);
      if (uVar3 < 8) {
        return;
      }
      uVar3 = uVar3 & 0xfffffff8;
      break;
    case 7:
      uVar3 = (uint)ptr->content;
      if ((uVar3 & 3) != 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  (&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x2b7,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                   "\"Don\'t know how to handle non-STRUCT inline composite.\"",
                   (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
        kj::_::Debug::Fault::fatal(&local_50);
      }
      uVar2 = *(ushort *)((long)&ptr->content + 4);
      uVar1 = *(ushort *)((long)&ptr->content + 6);
      uVar4 = (uint)uVar1;
      uVar3 = uVar3 >> 2 & 0x1fffffff;
      uVar5 = (ulong)uVar3;
      if (uVar1 == 0) {
        uVar4 = 0;
      }
      else if (uVar3 != 0) {
        local_40 = (ulong)uVar2 << 3;
        iVar6 = 0;
        local_48 = ptr;
        local_38 = uVar5;
        do {
          ptr = (word *)((long)&(((WirePointer *)ptr)->offsetAndKind).value + local_40);
          uVar3 = uVar4;
          do {
            ptr = (word *)((WirePointer *)ptr + 1);
            zeroObject(segment,capTable,(WirePointer *)ptr);
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
          iVar6 = iVar6 + 1;
        } while (iVar6 != (int)local_38);
        uVar2 = *(ushort *)((long)&local_48->content + 4);
        uVar4 = (uint)*(ushort *)((long)&local_48->content + 6);
        uVar5 = local_38;
        ptr = local_48;
      }
      uVar5 = ((ulong)uVar4 + (ulong)uVar2) * uVar5;
      if (0x1ffffffe < uVar5) {
        zeroObject::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_50);
      }
      iVar6 = (int)uVar5 + 1;
      if (iVar6 == 0) {
        return;
      }
      memset(ptr,0,(ulong)(uint)(iVar6 * 8));
      return;
    }
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2d4,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
               (char (*) [24])"Unexpected FAR pointer.");
    goto LAB_003e0e24;
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2d9,FAILED,(char *)0x0,"\"Unexpected OTHER pointer.\"",
               (char (*) [26])"Unexpected OTHER pointer.");
LAB_003e0e24:
    kj::_::Debug::Fault::~Fault(&local_50);
    return;
  }
  memset(ptr,0,(ulong)uVar3);
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable,
                         WirePointer* tag, word* ptr) {
    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (tag->kind()) {
      case WirePointer::STRUCT: {
        WirePointer* pointerSection =
            reinterpret_cast<WirePointer*>(ptr + tag->structRef.dataSize.get());
        for (auto i: kj::zeroTo(tag->structRef.ptrCount.get())) {
          zeroObject(segment, capTable, pointerSection + i);
        }
        zeroMemory(ptr, tag->structRef.wordSize());
        break;
      }
      case WirePointer::LIST: {
        switch (tag->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            zeroMemory(ptr, roundBitsUpToWords(
                upgradeBound<uint64_t>(tag->listRef.elementCount()) *
                dataBitsPerElement(tag->listRef.elementSize())));
            break;
          }
          case ElementSize::POINTER: {
            WirePointer* typedPtr = reinterpret_cast<WirePointer*>(ptr);
            auto count = tag->listRef.elementCount() * (ONE * POINTERS / ELEMENTS);
            for (auto i: kj::zeroTo(count)) {
              zeroObject(segment, capTable, typedPtr + i);
            }
            zeroMemory(typedPtr, count);
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            WirePointer* elementTag = reinterpret_cast<WirePointer*>(ptr);

            KJ_ASSERT(elementTag->kind() == WirePointer::STRUCT,
                  "Don't know how to handle non-STRUCT inline composite.");
            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            auto count = elementTag->inlineCompositeListElementCount();
            if (pointerCount > ZERO * POINTERS) {
              word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  zeroObject(segment, capTable, reinterpret_cast<WirePointer*>(pos));
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }

            auto wordsPerElement = elementTag->structRef.wordSize() / ELEMENTS;
            zeroMemory(ptr, assertMaxBits<SEGMENT_WORD_COUNT_BITS>(POINTER_SIZE_IN_WORDS +
                upgradeBound<uint64_t>(count) * wordsPerElement, []() {
                  KJ_FAIL_ASSERT("encountered list pointer in builder which is too large to "
                      "possibly fit in a segment. Bug in builder code?");
                }));
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        KJ_FAIL_ASSERT("Unexpected OTHER pointer.") {
          break;
        }
        break;
    }
  }